

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
diagonal_product_evaluator_base<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_2>
::~diagonal_product_evaluator_base
          (diagonal_product_evaluator_base<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_2>
           *this)

{
  diagonal_product_evaluator_base<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_2>
  *this_local;
  
  evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::~evaluator(&this->m_matImpl);
  evaluator<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::~evaluator(&this->m_diagImpl);
  evaluator_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>_>
  ::~evaluator_base((evaluator_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>_>
                     *)this);
  return;
}

Assistant:

struct diagonal_product_evaluator_base
  : evaluator_base<Derived>
{
   typedef typename ScalarBinaryOpTraits<typename MatrixType::Scalar, typename DiagonalType::Scalar>::ReturnType Scalar;
public:
  enum {
    CoeffReadCost = int(NumTraits<Scalar>::MulCost) + int(evaluator<MatrixType>::CoeffReadCost) + int(evaluator<DiagonalType>::CoeffReadCost),

    MatrixFlags = evaluator<MatrixType>::Flags,
    DiagFlags = evaluator<DiagonalType>::Flags,

    _StorageOrder = (Derived::MaxRowsAtCompileTime==1 && Derived::MaxColsAtCompileTime!=1) ? RowMajor
                  : (Derived::MaxColsAtCompileTime==1 && Derived::MaxRowsAtCompileTime!=1) ? ColMajor
                  : MatrixFlags & RowMajorBit ? RowMajor : ColMajor,
    _SameStorageOrder = _StorageOrder == (MatrixFlags & RowMajorBit ? RowMajor : ColMajor),

    _ScalarAccessOnDiag =  !((int(_StorageOrder) == ColMajor && int(ProductOrder) == OnTheLeft)
                           ||(int(_StorageOrder) == RowMajor && int(ProductOrder) == OnTheRight)),
    _SameTypes = is_same<typename MatrixType::Scalar, typename DiagonalType::Scalar>::value,
    // FIXME currently we need same types, but in the future the next rule should be the one
    //_Vectorizable = bool(int(MatrixFlags)&PacketAccessBit) && ((!_PacketOnDiag) || (_SameTypes && bool(int(DiagFlags)&PacketAccessBit))),
    _Vectorizable =   bool(int(MatrixFlags)&PacketAccessBit)
                  &&  _SameTypes
                  && (_SameStorageOrder || (MatrixFlags&LinearAccessBit)==LinearAccessBit)
                  && (_ScalarAccessOnDiag || (bool(int(DiagFlags)&PacketAccessBit))),
    _LinearAccessMask = (MatrixType::RowsAtCompileTime==1 || MatrixType::ColsAtCompileTime==1) ? LinearAccessBit : 0,
    Flags = ((HereditaryBits|_LinearAccessMask) & (unsigned int)(MatrixFlags)) | (_Vectorizable ? PacketAccessBit : 0),
    Alignment = evaluator<MatrixType>::Alignment,

    AsScalarProduct =     (DiagonalType::SizeAtCompileTime==1)
                      ||  (DiagonalType::SizeAtCompileTime==Dynamic && MatrixType::RowsAtCompileTime==1 && ProductOrder==OnTheLeft)
                      ||  (DiagonalType::SizeAtCompileTime==Dynamic && MatrixType::ColsAtCompileTime==1 && ProductOrder==OnTheRight)
  };

  EIGEN_DEVICE_FUNC diagonal_product_evaluator_base(const MatrixType &mat, const DiagonalType &diag)
    : m_diagImpl(diag), m_matImpl(mat)
  {
    EIGEN_INTERNAL_CHECK_COST_VALUE(NumTraits<Scalar>::MulCost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
  }

  EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE const Scalar coeff(Index idx) const
  {
    if(AsScalarProduct)
      return m_diagImpl.coeff(0) * m_matImpl.coeff(idx);
    else
      return m_diagImpl.coeff(idx) * m_matImpl.coeff(idx);
  }